

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O0

void ffswap2(short *svalues,long nvals)

{
  size_t nvals_00;
  size_t in_RSI;
  short *in_RDI;
  size_t peel;
  long ii;
  ulong local_18;
  
  if ((long)in_RDI % 2 == 0) {
    nvals_00 = get_peel(in_RDI,2,in_RSI,0x10);
    ffswap2_slow(in_RDI,nvals_00);
    for (local_18 = nvals_00; local_18 < (in_RSI - nvals_00) - (in_RSI - nvals_00 & 7);
        local_18 = local_18 + 8) {
      swap2_sse2((char *)(in_RDI + local_18));
    }
    ffswap2_slow(in_RDI + local_18,in_RSI - local_18);
  }
  else {
    ffswap2_slow(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void ffswap2(short *svalues,  /* IO - pointer to shorts to be swapped    */
             long nvals)     /* I  - number of shorts to be swapped     */
/*
  swap the bytes in the input short integers: ( 0 1 -> 1 0 )
*/
{
    if ((long)svalues % 2 != 0) { /* should not happen */
        ffswap2_slow(svalues, nvals);
        return;
    }

    long ii;
    size_t peel = get_peel((void*)&svalues[0], sizeof(svalues[0]), nvals, 16);

    ffswap2_slow(svalues, peel);
    for (ii = peel; ii < (nvals - peel - (nvals - peel) % 8); ii+=8) {
        swap2_sse2((char*)&svalues[ii]);
    }
    ffswap2_slow(&svalues[ii], nvals - ii);
}